

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.cpp
# Opt level: O0

void __thiscall TimerTest_syncrhonizedTimers_Test::TestBody(TimerTest_syncrhonizedTimers_Test *this)

{
  __pthread_internal_list **this_00;
  bool bVar1;
  char *pcVar2;
  undefined1 local_118 [8];
  unique_lock<std::mutex> lock;
  Message local_100 [12];
  int local_f4;
  undefined1 local_f0 [8];
  AssertionResult gtest_ar;
  duration<long,_std::ratio<1L,_1000000000L>_> local_d8 [3];
  anon_class_24_3_f78a2375 local_c0;
  function<void_(jessilib::timer_&)> local_a8;
  undefined8 local_88;
  undefined1 local_80 [8];
  syncrhonized_timer timer_obj;
  undefined1 local_68 [4];
  int timers_running;
  mutex notifier_mutex;
  condition_variable notifier;
  TimerTest_syncrhonizedTimers_Test *this_local;
  
  this_00 = &notifier_mutex.super___mutex_base._M_mutex.__data.__list.__next;
  std::condition_variable::condition_variable((condition_variable *)this_00);
  std::mutex::mutex((mutex *)local_68);
  timer_obj.super_timer.m_context.
  super___shared_ptr<jessilib::impl::timer_context,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _4_4_ = 0;
  local_88 = 1000000;
  local_c0.timers_running =
       (int *)((long)&timer_obj.super_timer.m_context.
                      super___shared_ptr<jessilib::impl::timer_context,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi + 4);
  local_c0.notifier = (condition_variable *)this_00;
  local_c0.notifier_mutex = (mutex *)local_68;
  std::function<void(jessilib::timer&)>::
  function<TimerTest_syncrhonizedTimers_Test::TestBody()::__0,void>
            ((function<void(jessilib::timer&)> *)&local_a8,&local_c0);
  jessilib::syncrhonized_timer::syncrhonized_timer
            ((syncrhonized_timer *)local_80,local_88,&local_a8);
  std::function<void_(jessilib::timer_&)>::~function(&local_a8);
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_4_ = 3;
  local_d8[0] = std::chrono::operator*
                          (&period,(int *)((long)&gtest_ar.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                          + 4));
  std::this_thread::sleep_for<long,std::ratio<1l,1000000000l>>(local_d8);
  local_f4 = 1;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_f0,"timers_running","1",
             (int *)((long)&timer_obj.super_timer.m_context.
                            super___shared_ptr<jessilib::impl::timer_context,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi + 4),&local_f4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f0);
  if (!bVar1) {
    testing::Message::Message(local_100);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&lock._M_owns,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/timer.cpp"
               ,0xd3,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&lock._M_owns,local_100);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&lock._M_owns);
    testing::Message::~Message(local_100);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f0);
  std::condition_variable::notify_all();
  std::unique_lock<std::mutex>::unique_lock
            ((unique_lock<std::mutex> *)local_118,(mutex_type *)local_68);
  std::condition_variable::wait<TimerTest_syncrhonizedTimers_Test::TestBody()::__1>
            ((condition_variable *)&notifier_mutex.super___mutex_base._M_mutex.__data.__list.__next,
             (unique_lock<std::mutex> *)local_118,
             (int *)((long)&timer_obj.super_timer.m_context.
                            super___shared_ptr<jessilib::impl::timer_context,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi + 4));
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_118);
  jessilib::syncrhonized_timer::~syncrhonized_timer((syncrhonized_timer *)local_80);
  std::condition_variable::~condition_variable
            ((condition_variable *)&notifier_mutex.super___mutex_base._M_mutex.__data.__list.__next)
  ;
  return;
}

Assistant:

TEST(TimerTest, syncrhonizedTimers) {
	std::condition_variable notifier;
	std::mutex notifier_mutex;
	int timers_running = 0;

	// Spin up timer
	syncrhonized_timer timer_obj{period, [&notifier, &notifier_mutex, &timers_running](timer& in_timer) {
		std::unique_lock<std::mutex> lock(notifier_mutex);
		++timers_running;

		// Wait for a few more timer periods to pass before proceeding
		notifier.wait(lock);

		// We're done here; cancel
		--timers_running;
		notifier.notify_one();
		in_timer.cancel();
	}};

	// Wait for some timers to fire
	std::this_thread::sleep_for(period * 3);
	EXPECT_EQ(timers_running, 1);

	// Notify timers to close
	notifier.notify_all();

	// Wait for timers to complete
	std::unique_lock<std::mutex> lock(notifier_mutex);
	notifier.wait(lock, [&timers_running]() {
		return timers_running == 0;
	});
}